

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O2

string * __thiscall
assembler::asmcode::operand_to_string_abi_cxx11_
          (string *__return_storage_ptr__,asmcode *this,operand op)

{
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "EMPTY";
    break;
  case 1:
    __s = "AL";
    break;
  case 2:
    __s = "AH";
    break;
  case 3:
    __s = "BL";
    break;
  case 4:
    __s = "BH";
    break;
  case 5:
    __s = "CL";
    break;
  case 6:
    __s = "CH";
    break;
  case 7:
    __s = "DL";
    break;
  case 8:
    __s = "DH";
    break;
  case 9:
    __s = "RAX";
    break;
  case 10:
    __s = "RBX";
    break;
  case 0xb:
    __s = "RCX";
    break;
  case 0xc:
    __s = "RDX";
    break;
  case 0xd:
    __s = "RSI";
    break;
  case 0xe:
    __s = "RDI";
    break;
  case 0xf:
    __s = "RSP";
    break;
  case 0x10:
    __s = "RBP";
    break;
  case 0x11:
    __s = "R8";
    break;
  case 0x12:
    __s = "R9";
    break;
  case 0x13:
    __s = "R10";
    break;
  case 0x14:
    __s = "R11";
    break;
  case 0x15:
    __s = "R12";
    break;
  case 0x16:
    __s = "R13";
    break;
  case 0x17:
    __s = "R14";
    break;
  case 0x18:
    __s = "R15";
    break;
  case 0x19:
    __s = "MEM_RAX";
    break;
  case 0x1a:
    __s = "MEM_RBX";
    break;
  case 0x1b:
    __s = "MEM_RCX";
    break;
  case 0x1c:
    __s = "MEM_RDX";
    break;
  case 0x1d:
    __s = "MEM_RDI";
    break;
  case 0x1e:
    __s = "MEM_RSI";
    break;
  case 0x1f:
    __s = "MEM_RSP";
    break;
  case 0x20:
    __s = "MEM_RBP";
    break;
  case 0x21:
    __s = "MEM_R8";
    break;
  case 0x22:
    __s = "MEM_R9";
    break;
  case 0x23:
    __s = "MEM_R10";
    break;
  case 0x24:
    __s = "MEM_R11";
    break;
  case 0x25:
    __s = "MEM_R12";
    break;
  case 0x26:
    __s = "MEM_R13";
    break;
  case 0x27:
    __s = "MEM_R14";
    break;
  case 0x28:
    __s = "MEM_R15";
    break;
  case 0x29:
    __s = "BYTE_MEM_RAX";
    break;
  case 0x2a:
    __s = "BYTE_MEM_RBX";
    break;
  case 0x2b:
    __s = "BYTE_MEM_RCX";
    break;
  case 0x2c:
    __s = "BYTE_MEM_RDX";
    break;
  case 0x2d:
    __s = "BYTE_MEM_RDI";
    break;
  case 0x2e:
    __s = "BYTE_MEM_RSI";
    break;
  case 0x2f:
    __s = "BYTE_MEM_RSP";
    break;
  case 0x30:
    __s = "BYTE_MEM_RBP";
    break;
  case 0x31:
    __s = "BYTE_MEM_R8";
    break;
  case 0x32:
    __s = "BYTE_MEM_R9";
    break;
  case 0x33:
    __s = "BYTE_MEM_R10";
    break;
  case 0x34:
    __s = "BYTE_MEM_R11";
    break;
  case 0x35:
    __s = "BYTE_MEM_R12";
    break;
  case 0x36:
    __s = "BYTE_MEM_R13";
    break;
  case 0x37:
    __s = "BYTE_MEM_R14";
    break;
  case 0x38:
    __s = "BYTE_MEM_R15";
    break;
  case 0x39:
    __s = "NUMBER";
    break;
  case 0x3a:
    __s = "ST0";
    break;
  case 0x3b:
    __s = "ST1";
    break;
  case 0x3c:
    __s = "ST2";
    break;
  case 0x3d:
    __s = "ST3";
    break;
  case 0x3e:
    __s = "ST4";
    break;
  case 0x3f:
    __s = "ST5";
    break;
  case 0x40:
    __s = "ST6";
    break;
  case 0x41:
    __s = "ST7";
    break;
  case 0x42:
    __s = "LABELADDRESS";
    break;
  case 0x43:
    __s = "XMM0";
    break;
  case 0x44:
    __s = "XMM1";
    break;
  case 0x45:
    __s = "XMM2";
    break;
  case 0x46:
    __s = "XMM3";
    break;
  case 0x47:
    __s = "XMM4";
    break;
  case 0x48:
    __s = "XMM5";
    break;
  case 0x49:
    __s = "XMM6";
    break;
  case 0x4a:
    __s = "XMM7";
    break;
  case 0x4b:
    __s = "XMM8";
    break;
  case 0x4c:
    __s = "XMM9";
    break;
  case 0x4d:
    __s = "XMM10";
    break;
  case 0x4e:
    __s = "XMM11";
    break;
  case 0x4f:
    __s = "XMM12";
    break;
  case 0x50:
    __s = "XMM13";
    break;
  case 0x51:
    __s = "XMM14";
    break;
  case 0x52:
    __s = "XMM15";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string asmcode::operand_to_string(operand op)
  {
  switch (op)
    {
    case asmcode::EMPTY: return std::string("EMPTY");
    case asmcode::AL: return std::string("AL");
    case asmcode::AH: return std::string("AH");
    case asmcode::BL: return std::string("BL");
    case asmcode::BH: return std::string("BH");
    case asmcode::CL: return std::string("CL");
    case asmcode::CH: return std::string("CH");
    case asmcode::DL: return std::string("DL");
    case asmcode::DH: return std::string("DH");   
    case asmcode::RAX: return std::string("RAX");
    case asmcode::RBX: return std::string("RBX");
    case asmcode::RCX: return std::string("RCX");
    case asmcode::RDX: return std::string("RDX");
    case asmcode::RDI: return std::string("RDI");
    case asmcode::RSI: return std::string("RSI");
    case asmcode::RSP: return std::string("RSP");
    case asmcode::RBP: return std::string("RBP");
    case asmcode::R8:  return std::string("R8");
    case asmcode::R9:  return std::string("R9");
    case asmcode::R10: return std::string("R10");
    case asmcode::R11: return std::string("R11");
    case asmcode::R12: return std::string("R12");
    case asmcode::R13: return std::string("R13");
    case asmcode::R14: return std::string("R14");
    case asmcode::R15: return std::string("R15");  
    case asmcode::MEM_RAX: return std::string("MEM_RAX");
    case asmcode::MEM_RBX: return std::string("MEM_RBX");
    case asmcode::MEM_RCX: return std::string("MEM_RCX");
    case asmcode::MEM_RDX: return std::string("MEM_RDX");
    case asmcode::MEM_RDI: return std::string("MEM_RDI");
    case asmcode::MEM_RSI: return std::string("MEM_RSI");
    case asmcode::MEM_RSP: return std::string("MEM_RSP");
    case asmcode::MEM_RBP: return std::string("MEM_RBP");
    case asmcode::MEM_R8:  return std::string("MEM_R8");
    case asmcode::MEM_R9:  return std::string("MEM_R9");
    case asmcode::MEM_R10: return std::string("MEM_R10");
    case asmcode::MEM_R11: return std::string("MEM_R11");
    case asmcode::MEM_R12: return std::string("MEM_R12");
    case asmcode::MEM_R13: return std::string("MEM_R13");
    case asmcode::MEM_R14: return std::string("MEM_R14");
    case asmcode::MEM_R15: return std::string("MEM_R15");
    case asmcode::BYTE_MEM_RAX: return std::string("BYTE_MEM_RAX");
    case asmcode::BYTE_MEM_RBX: return std::string("BYTE_MEM_RBX");
    case asmcode::BYTE_MEM_RCX: return std::string("BYTE_MEM_RCX");
    case asmcode::BYTE_MEM_RDX: return std::string("BYTE_MEM_RDX");
    case asmcode::BYTE_MEM_RDI: return std::string("BYTE_MEM_RDI");
    case asmcode::BYTE_MEM_RSI: return std::string("BYTE_MEM_RSI");
    case asmcode::BYTE_MEM_RSP: return std::string("BYTE_MEM_RSP");
    case asmcode::BYTE_MEM_RBP: return std::string("BYTE_MEM_RBP");
    case asmcode::BYTE_MEM_R8:  return std::string("BYTE_MEM_R8");
    case asmcode::BYTE_MEM_R9:  return std::string("BYTE_MEM_R9");
    case asmcode::BYTE_MEM_R10: return std::string("BYTE_MEM_R10");
    case asmcode::BYTE_MEM_R11: return std::string("BYTE_MEM_R11");
    case asmcode::BYTE_MEM_R12: return std::string("BYTE_MEM_R12");
    case asmcode::BYTE_MEM_R13: return std::string("BYTE_MEM_R13");
    case asmcode::BYTE_MEM_R14: return std::string("BYTE_MEM_R14");
    case asmcode::BYTE_MEM_R15: return std::string("BYTE_MEM_R15");  
    case asmcode::NUMBER: return std::string("NUMBER");
    case asmcode::ST0:  return std::string("ST0");
    case asmcode::ST1:  return std::string("ST1");
    case asmcode::ST2:  return std::string("ST2");
    case asmcode::ST3:  return std::string("ST3");
    case asmcode::ST4:  return std::string("ST4");
    case asmcode::ST5:  return std::string("ST5");
    case asmcode::ST6:  return std::string("ST6");
    case asmcode::ST7:  return std::string("ST7");
    case asmcode::XMM0: return std::string("XMM0");
    case asmcode::XMM1: return std::string("XMM1");
    case asmcode::XMM2: return std::string("XMM2");
    case asmcode::XMM3: return std::string("XMM3");
    case asmcode::XMM4: return std::string("XMM4");
    case asmcode::XMM5: return std::string("XMM5");
    case asmcode::XMM6: return std::string("XMM6");
    case asmcode::XMM7: return std::string("XMM7");
    case asmcode::XMM8: return std::string("XMM8");
    case asmcode::XMM9: return std::string("XMM9");
    case asmcode::XMM10:return std::string("XMM10");
    case asmcode::XMM11:return std::string("XMM11");
    case asmcode::XMM12:return std::string("XMM12");
    case asmcode::XMM13:return std::string("XMM13");
    case asmcode::XMM14:return std::string("XMM14");
    case asmcode::XMM15:return std::string("XMM15");   
    case asmcode::LABELADDRESS: return std::string("LABELADDRESS");
    }
  return std::string();
  }